

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::ListFileScope::ListFileScope(ListFileScope *this,cmMakefile *mf,string *filenametoread)

{
  cmMakefile *pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  cmState *pcVar2;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar3;
  bool bVar4;
  cmStateSnapshot local_38;
  
  this->Makefile = mf;
  this->ReportError = true;
  cmListFileBacktrace::Push((cmListFileBacktrace *)&local_38,(string *)&mf->Backtrace);
  pcVar3 = local_38.Position.Tree;
  pcVar2 = local_38.State;
  pcVar1 = this->Makefile;
  local_38.State = (cmState *)0x0;
  local_38.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
  this_00 = (pcVar1->Backtrace).TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (pcVar1->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pcVar2;
  (pcVar1->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (local_38.Position.Tree != (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.Position.Tree);
    }
  }
  cmState::CreateInlineListFileSnapshot
            (&local_38,
             (this->Makefile->GlobalGenerator->CMakeInstance->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&this->Makefile->StateSnapshot,
             filenametoread);
  pcVar1 = this->Makefile;
  (pcVar1->StateSnapshot).Position.Position = local_38.Position.Position;
  (pcVar1->StateSnapshot).State = local_38.State;
  (pcVar1->StateSnapshot).Position.Tree = local_38.Position.Tree;
  bVar4 = cmStateSnapshot::IsValid(&this->Makefile->StateSnapshot);
  if (bVar4) {
    PushFunctionBlockerBarrier(this->Makefile);
    return;
  }
  __assert_fail("this->Makefile->StateSnapshot.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmMakefile.cxx"
                ,0x25a,"cmMakefile::ListFileScope::ListFileScope(cmMakefile *, const std::string &)"
               );
}

Assistant:

ListFileScope(cmMakefile* mf, std::string const& filenametoread)
    : Makefile(mf)
    , ReportError(true)
  {
    this->Makefile->Backtrace = this->Makefile->Backtrace.Push(filenametoread);

    this->Makefile->StateSnapshot =
      this->Makefile->GetState()->CreateInlineListFileSnapshot(
        this->Makefile->StateSnapshot, filenametoread);
    assert(this->Makefile->StateSnapshot.IsValid());

    this->Makefile->PushFunctionBlockerBarrier();
  }